

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderCommonFunctionTests.cpp
# Opt level: O2

double __thiscall
vkt::shaderexecutor::anon_unknown_0::frexp(anon_unknown_0 *this,double __x,int *__exponent)

{
  undefined1 auVar1 [16];
  double dVar2;
  StorageType SVar3;
  undefined4 unaff_R12D;
  StorageType s;
  int iVar4;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Db;
  undefined4 in_XMM0_Dc;
  undefined4 in_XMM0_Dd;
  Float32 fpValue;
  Float<unsigned_int,_8,_23,_127,_3U> local_24;
  
  if ((SUB84(__x,0) != 0.0) || (NAN(SUB84(__x,0)))) {
    auVar1._8_4_ = in_XMM0_Dc;
    auVar1._0_8_ = __x;
    auVar1._12_4_ = in_XMM0_Dd;
    iVar4 = movmskps(unaff_R12D,auVar1);
    SVar3 = tcu::Float<unsigned_int,_8,_23,_127,_3U>::mantissa(&local_24);
    *(StorageType *)this = (SVar3 & 0x7fffff) + iVar4 * -0x80000000 + 0x3f000000;
    iVar4 = tcu::Float<unsigned_int,_8,_23,_127,_3U>::exponent(&local_24);
    dVar2 = (double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da);
    iVar4 = iVar4 + 1;
  }
  else {
    dVar2 = (double)((ulong)__x & 0x8000000080000000);
    *(int *)this = SUB84(dVar2,0);
    iVar4 = 0;
  }
  *__exponent = iVar4;
  return dVar2;
}

Assistant:

static inline void frexp (float in, float* significand, int* exponent)
{
	const tcu::Float32 fpValue(in);

	if (!fpValue.isZero())
	{
		// Construct float that has exactly the mantissa, and exponent of -1.
		*significand	= tcu::Float32::construct(fpValue.sign(), -1, fpValue.mantissa()).asFloat();
		*exponent		= fpValue.exponent()+1;
	}
	else
	{
		*significand	= fpValue.sign() < 0 ? -0.0f : 0.0f;
		*exponent		= 0;
	}
}